

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjToReal(jx9_value *pObj)

{
  jx9_real jVar1;
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 4U) == 0) {
    jVar1 = MemObjRealValue(pObj);
    (pObj->x).rVal = jVar1;
    SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 4;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToReal(jx9_value *pObj)
{
	if((pObj->iFlags & MEMOBJ_REAL) == 0 ){
		/* Preform the conversion */
		pObj->x.rVal = MemObjRealValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_REAL);
	}
	return SXRET_OK;
}